

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_active_quality(int q,int gfu_boost,int low,int high,int *low_motion_minq,
                      int *high_motion_minq)

{
  int adjustment;
  int qdiff;
  int offset;
  int gap;
  int *high_motion_minq_local;
  int *low_motion_minq_local;
  int high_local;
  int low_local;
  int gfu_boost_local;
  int q_local;
  int local_4;
  
  if (high < gfu_boost) {
    local_4 = low_motion_minq[q];
  }
  else if (gfu_boost < low) {
    local_4 = high_motion_minq[q];
  }
  else {
    local_4 = low_motion_minq[q] +
              ((high - gfu_boost) * (high_motion_minq[q] - low_motion_minq[q]) + (high - low >> 1))
              / (high - low);
  }
  return local_4;
}

Assistant:

static int get_active_quality(int q, int gfu_boost, int low, int high,
                              int *low_motion_minq, int *high_motion_minq) {
  if (gfu_boost > high) {
    return low_motion_minq[q];
  } else if (gfu_boost < low) {
    return high_motion_minq[q];
  } else {
    const int gap = high - low;
    const int offset = high - gfu_boost;
    const int qdiff = high_motion_minq[q] - low_motion_minq[q];
    const int adjustment = ((offset * qdiff) + (gap >> 1)) / gap;
    return low_motion_minq[q] + adjustment;
  }
}